

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O1

parser_error parse_object_property_desc(parser *p)

{
  parser_error pVar1;
  void *pvVar2;
  char *pcVar3;
  
  pvVar2 = parser_priv(p);
  pcVar3 = parser_getstr(p,"desc");
  if (pvVar2 == (void *)0x0) {
    pVar1 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    string_free(*(char **)((long)pvVar2 + 0xd0));
    pcVar3 = string_make(pcVar3);
    *(char **)((long)pvVar2 + 0xd0) = pcVar3;
    pVar1 = PARSE_ERROR_NONE;
  }
  return pVar1;
}

Assistant:

static enum parser_error parse_object_property_desc(struct parser *p) {
	struct obj_property *prop = parser_priv(p);
	const char *desc = parser_getstr(p, "desc");

	if (!prop) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	string_free(prop->desc);
	prop->desc = string_make(desc);
	return PARSE_ERROR_NONE;
}